

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramPipelineStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PipelineProgramCase::iterate(PipelineProgramCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  TestError *this_00;
  GLbitfield GVar6;
  long lVar7;
  GLbitfield stages;
  ProgramPipeline pipeline;
  ScopedLogSection section;
  CallLogWrapper gl;
  ShaderProgram program;
  ResultCollector result;
  ProgramSources sources;
  string local_278;
  ScopedLogSection local_258;
  string local_250;
  CallLogWrapper local_230;
  undefined1 local_218 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200 [8];
  GLuint local_180;
  bool local_158;
  ResultCollector local_148;
  undefined1 local_f8 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_68;
  undefined1 local_48 [32];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_230,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_148,pTVar3,(string *)local_f8);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  GVar5 = this->m_targetStage;
  GVar6 = 0x20;
  if (GVar5 == 0x8b30) {
    GVar6 = 2;
  }
  stages = 1;
  if (GVar5 != 0x8b31) {
    stages = GVar6;
  }
  memset(local_f8,0,0xac);
  local_48._0_8_ = (pointer)0x0;
  local_48[8] = 0;
  local_48._9_7_ = 0;
  local_48[0x10] = 0;
  local_48._17_8_ = 0;
  if (GVar5 == 0x8b30) {
    local_48._17_8_ = 0x100000000000000;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,
               "#version 310 es\nin highp vec4 v_color;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
               ,"");
    local_218._0_4_ = 1;
    local_218._8_8_ = local_200;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_218 + 8),local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p +
               CONCAT44(local_278._M_string_length._4_4_,(GLuint)local_278._M_string_length));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_f8 + (ulong)(uint)local_218._0_4_ * 0x18),(value_type *)(local_218 + 8));
  }
  else if (GVar5 == 0x91b9) {
    local_48._17_8_ = 0x100000000000000;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,
               "#version 310 es\nlayout (local_size_x = 1, local_size_y = 1) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
               ,"");
    local_218._0_4_ = 5;
    local_218._8_8_ = local_200;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_218 + 8),local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p +
               CONCAT44(local_278._M_string_length._4_4_,(GLuint)local_278._M_string_length));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_f8 + (ulong)(uint)local_218._0_4_ * 0x18),(value_type *)(local_218 + 8));
  }
  else {
    if (GVar5 != 0x8b31) goto LAB_0151654a;
    local_48._17_8_ = 0x100000000000000;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,
               "#version 310 es\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
               ,"");
    local_218._0_4_ = 0;
    local_218._8_8_ = local_200;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_218 + 8),local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p +
               CONCAT44(local_278._M_string_length._4_4_,(GLuint)local_278._M_string_length));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_f8 + (ulong)(uint)local_218._0_4_ * 0x18),(value_type *)(local_218 + 8));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._8_8_ != local_200) {
    operator_delete((void *)local_218._8_8_,local_200[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
LAB_0151654a:
  local_230.m_enableLog = true;
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_218,((this->super_TestCase).m_context)->m_renderCtx,
             (ProgramSources *)local_f8);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_278.field_2;
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"program","");
  paVar2 = &local_250.field_2;
  local_250._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Program","");
  tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar3,&local_278,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)local_218);
  tcu::TestLog::endSection(local_258.m_log);
  if (local_158 != false) {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_278._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Initial","");
    local_250._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar3,&local_278,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar1) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    glu::ProgramPipeline::ProgramPipeline
              ((ProgramPipeline *)&local_278,((this->super_TestCase).m_context)->m_renderCtx);
    glu::CallLogWrapper::glBindProgramPipeline(&local_230,(GLuint)local_278._M_string_length);
    GVar5 = glu::CallLogWrapper::glGetError(&local_230);
    glu::checkError(GVar5,"setup pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,200);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              (&local_148,&local_230,(GLuint)local_278._M_string_length,this->m_targetStage,0,
               this->m_verifier);
    glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)&local_278);
    tcu::TestLog::endSection(local_258.m_log);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_278._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Set","");
    local_250._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Set","");
    tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar3,&local_278,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar1) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    glu::ProgramPipeline::ProgramPipeline
              ((ProgramPipeline *)&local_278,((this->super_TestCase).m_context)->m_renderCtx);
    glu::CallLogWrapper::glBindProgramPipeline(&local_230,(GLuint)local_278._M_string_length);
    glu::CallLogWrapper::glUseProgramStages
              (&local_230,(GLuint)local_278._M_string_length,stages,local_180);
    GVar5 = glu::CallLogWrapper::glGetError(&local_230);
    glu::checkError(GVar5,"setup pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0xd3);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              (&local_148,&local_230,(GLuint)local_278._M_string_length,this->m_targetStage,
               local_180,this->m_verifier);
    glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)&local_278);
    tcu::TestLog::endSection(local_258.m_log);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_218);
    tcu::ResultCollector::setTestContextResult
              (&local_148,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_48);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_68);
    lVar7 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_f8 + lVar7));
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.m_message._M_dataplus._M_p != &local_148.m_message.field_2) {
      operator_delete(local_148.m_message._M_dataplus._M_p,
                      local_148.m_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.m_prefix._M_dataplus._M_p != &local_148.m_prefix.field_2) {
      operator_delete(local_148.m_prefix._M_dataplus._M_p,
                      local_148.m_prefix.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::~CallLogWrapper(&local_230);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"failed to build program","")
  ;
  tcu::TestError::TestError(this_00,&local_278);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

PipelineProgramCase::IterateResult PipelineProgramCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const int				stageBit	= (m_targetStage == GL_VERTEX_SHADER)	? (GL_VERTEX_SHADER_BIT)
										: (m_targetStage == GL_FRAGMENT_SHADER)	? (GL_FRAGMENT_SHADER_BIT)
										: (GL_COMPUTE_SHADER_BIT);
	glu::ProgramSources	sources;

	if (m_targetStage == GL_VERTEX_SHADER)
		sources << glu::ProgramSeparable(true) << glu::VertexSource(s_vertexSource);
	else if (m_targetStage == GL_FRAGMENT_SHADER)
		sources << glu::ProgramSeparable(true) << glu::FragmentSource(s_fragmentSource);
	else if (m_targetStage == GL_COMPUTE_SHADER)
		sources << glu::ProgramSeparable(true) << glu::ComputeSource(s_computeSource);
	else
		DE_ASSERT(false);

	gl.enableLogging(true);

	{
		glu::ShaderProgram program(m_context.getRenderContext(), sources);

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "program", "Program");
			m_testCtx.getLog() << program;
		}

		if (!program.isOk())
			throw tcu::TestError("failed to build program");

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Initial", "Initial");
			glu::ProgramPipeline		pipeline	(m_context.getRenderContext());

			gl.glBindProgramPipeline(pipeline.getPipeline());
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup pipeline");

			verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), m_targetStage, 0, m_verifier);
		}

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Set", "Set");
			glu::ProgramPipeline		pipeline	(m_context.getRenderContext());

			gl.glBindProgramPipeline(pipeline.getPipeline());
			gl.glUseProgramStages(pipeline.getPipeline(), stageBit, program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup pipeline");

			verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), m_targetStage, program.getProgram(), m_verifier);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}